

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

buffer_appender<char> __thiscall
fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>::
format<fmt::v7::detail::buffer_appender<char>>
          (fallback_formatter<diy::DynamicPoint<float,_4UL>,_char,_void> *this,
          DynamicPoint<float,_4UL> *value,
          basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx)

{
  char *s;
  size_t count;
  iterator iVar1;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *in_RDX;
  basic_string_view<char> str;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  allocator<char> *in_stack_fffffffffffffd58;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_00;
  basic_string_view<char> local_268;
  void *local_258;
  allocator<char> local_239 [153];
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *in_stack_fffffffffffffe60;
  basic_string_view<char> *in_stack_fffffffffffffe68;
  formatter<fmt::v7::basic_string_view<char>,_char,_void> *in_stack_fffffffffffffe70;
  DynamicPoint<float,_4UL> *in_stack_fffffffffffffef0;
  buffer<char> *in_stack_fffffffffffffef8;
  locale_ref in_stack_ffffffffffffff00;
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  std::allocator<char>::~allocator(local_239);
  local_258 = (void *)basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::locale
                                (in_RDX);
  format_value<char,diy::DynamicPoint<float,4ul>>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_ffffffffffffff00);
  this_00 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_239 + 1);
  s = buffer<char>::data((buffer<char> *)this_00);
  count = buffer<char>::size(&this_00->super_buffer<char>);
  basic_string_view<char>::basic_string_view(&local_268,s,count);
  iVar1 = formatter<fmt::v7::basic_string_view<char>,char,void>::
          format<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return (buffer_appender<char>)
         iVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

auto format(const T& value, basic_format_context<OutputIt, Char>& ctx)
      -> OutputIt {
    basic_memory_buffer<Char> buffer;
    format_value(buffer, value, ctx.locale());
    basic_string_view<Char> str(buffer.data(), buffer.size());
    return formatter<basic_string_view<Char>, Char>::format(str, ctx);
  }